

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O0

int prune_modes_based_on_tpl_stats
              (PruneInfoFromTpl *inter_cost_info_from_tpl,int *refs,int ref_mv_idx,
              PREDICTION_MODE this_mode,int prune_mode_level)

{
  int iVar1;
  PREDICTION_MODE in_CL;
  int in_EDX;
  int *in_RSI;
  long *in_RDI;
  int in_R8D;
  int64_t inter_cost_ref1;
  int64_t inter_cost_ref0;
  int is_comp_pred;
  int prune_index;
  int is_globalmv;
  int64_t cur_inter_cost;
  int prune_level;
  int64_t best_inter_cost;
  int have_newmv;
  long local_70;
  int local_68;
  long local_40;
  int local_4;
  
  iVar1 = have_newmv_in_inter_mode(in_CL);
  if ((in_R8D < 2) && (iVar1 != 0)) {
    local_4 = 0;
  }
  else if (*in_RDI == 0x7fffffffffffffff) {
    local_4 = 0;
  }
  else {
    local_68 = in_EDX;
    if (in_CL == '\x0f' || in_CL == '\x17') {
      local_68 = 3;
    }
    if (in_RSI[1] < 1) {
      local_40 = in_RDI[(long)(*in_RSI + -1) + 1];
    }
    else {
      local_70 = in_RDI[(long)(in_RSI[1] + -1) + 1];
      if (local_70 < in_RDI[(long)(*in_RSI + -1) + 1]) {
        local_70 = in_RDI[(long)(*in_RSI + -1) + 1];
      }
      local_40 = local_70;
    }
    if ((long)prune_modes_based_on_tpl_stats::tpl_inter_mode_prune_mul_factor[in_R8D + -1][local_68]
        * *in_RDI >> 2 < local_40) {
      local_4 = 1;
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

static inline int prune_modes_based_on_tpl_stats(
    PruneInfoFromTpl *inter_cost_info_from_tpl, const int *refs, int ref_mv_idx,
    const PREDICTION_MODE this_mode, int prune_mode_level) {
  const int have_newmv = have_newmv_in_inter_mode(this_mode);
  if ((prune_mode_level < 2) && have_newmv) return 0;

  const int64_t best_inter_cost = inter_cost_info_from_tpl->best_inter_cost;
  if (best_inter_cost == INT64_MAX) return 0;

  const int prune_level = prune_mode_level - 1;
  int64_t cur_inter_cost;

  const int is_globalmv =
      (this_mode == GLOBALMV) || (this_mode == GLOBAL_GLOBALMV);
  const int prune_index = is_globalmv ? MAX_REF_MV_SEARCH : ref_mv_idx;

  // Thresholds used for pruning:
  // Lower value indicates aggressive pruning and higher value indicates
  // conservative pruning which is set based on ref_mv_idx and speed feature.
  // 'prune_index' 0, 1, 2 corresponds to ref_mv indices 0, 1 and 2. prune_index
  // 3 corresponds to GLOBALMV/GLOBAL_GLOBALMV
  static const int tpl_inter_mode_prune_mul_factor[3][MAX_REF_MV_SEARCH + 1] = {
    { 6, 6, 6, 4 }, { 6, 4, 4, 4 }, { 5, 4, 4, 4 }
  };

  const int is_comp_pred = (refs[1] > INTRA_FRAME);
  if (!is_comp_pred) {
    cur_inter_cost = inter_cost_info_from_tpl->ref_inter_cost[refs[0] - 1];
  } else {
    const int64_t inter_cost_ref0 =
        inter_cost_info_from_tpl->ref_inter_cost[refs[0] - 1];
    const int64_t inter_cost_ref1 =
        inter_cost_info_from_tpl->ref_inter_cost[refs[1] - 1];
    // Choose maximum inter_cost among inter_cost_ref0 and inter_cost_ref1 for
    // more aggressive pruning
    cur_inter_cost = AOMMAX(inter_cost_ref0, inter_cost_ref1);
  }

  // Prune the mode if cur_inter_cost is greater than threshold times
  // best_inter_cost
  if (cur_inter_cost >
      ((tpl_inter_mode_prune_mul_factor[prune_level][prune_index] *
        best_inter_cost) >>
       2))
    return 1;
  return 0;
}